

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O1

int32_t ecs_get_child_count(ecs_world_t *world,ecs_entity_t entity)

{
  uint uVar1;
  int32_t iVar2;
  ecs_vector_t *vector;
  void *pvVar3;
  int32_t iVar4;
  ulong uVar5;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,entity);
  iVar4 = 0;
  if (vector != (ecs_vector_t *)0x0) {
    uVar1 = ecs_vector_count(vector);
    pvVar3 = _ecs_vector_first(vector,8,0x10);
    iVar4 = 0;
    if (0 < (int)uVar1) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        iVar2 = ecs_table_count(*(ecs_table_t **)((long)pvVar3 + uVar5 * 8));
        iVar4 = iVar4 + iVar2;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  return iVar4;
}

Assistant:

int32_t ecs_get_child_count(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_vector_t *tables = ecs_map_get_ptr(world->child_tables, ecs_vector_t*, entity);
    if (!tables) {
        return 0;
    } else {
        int32_t count = 0;

        ecs_vector_each(tables, ecs_table_t*, table_ptr, {
            ecs_table_t *table = *table_ptr;
            count += ecs_table_count(table);
        });

        return count;
    }
}